

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::RgbaInputFile::setFrameBuffer(RgbaInputFile *this,Rgba *base,size_t xStride,size_t yStride)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pthread_mutex_t *__mutex;
  pointer pcVar2;
  int iVar3;
  RgbaChannels RVar4;
  undefined1 in_R10B;
  size_t yst;
  size_t xst;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  FrameBuffer fb;
  Slice local_60;
  
  __mutex = (pthread_mutex_t *)this->_fromYca;
  if (__mutex == (pthread_mutex_t *)0x0) {
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    RVar4 = channels(this);
    xst = xStride << 3;
    yst = yStride << 3;
    paVar1 = &__str.field_2;
    __str._M_dataplus._M_p = (pointer)paVar1;
    if ((RVar4 & WRITE_Y) == 0) {
      pcVar2 = (this->_channelNamePrefix)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar2,pcVar2 + (this->_channelNamePrefix)._M_string_length);
      std::__cxx11::string::append((char *)&__str);
      Slice::Slice(&local_60,HALF,(char *)base,xst,yst,1,1,0.0,(bool)in_R10B,false);
      FrameBuffer::insert(&fb,&__str,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = (this->_channelNamePrefix)._M_dataplus._M_p;
      __str._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar2,pcVar2 + (this->_channelNamePrefix)._M_string_length);
      std::__cxx11::string::append((char *)&__str);
      Slice::Slice(&local_60,HALF,(char *)&base->g,xst,yst,1,1,0.0,(bool)in_R10B,false);
      FrameBuffer::insert(&fb,&__str,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = (this->_channelNamePrefix)._M_dataplus._M_p;
      __str._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar2,pcVar2 + (this->_channelNamePrefix)._M_string_length);
      std::__cxx11::string::append((char *)&__str);
      Slice::Slice(&local_60,HALF,(char *)&base->b,xst,yst,1,1,0.0,(bool)in_R10B,false);
      FrameBuffer::insert(&fb,&__str,&local_60);
    }
    else {
      pcVar2 = (this->_channelNamePrefix)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar2,pcVar2 + (this->_channelNamePrefix)._M_string_length);
      std::__cxx11::string::append((char *)&__str);
      Slice::Slice(&local_60,HALF,(char *)base,xst,yst,1,1,0.0,(bool)in_R10B,false);
      FrameBuffer::insert(&fb,&__str,&local_60);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (this->_channelNamePrefix)._M_dataplus._M_p;
    __str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str,pcVar2,pcVar2 + (this->_channelNamePrefix)._M_string_length);
    std::__cxx11::string::append((char *)&__str);
    Slice::Slice(&local_60,HALF,(char *)&base->a,xst,yst,1,1,1.0,(bool)in_R10B,false);
    FrameBuffer::insert(&fb,&__str,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    InputPart::setFrameBuffer(this->_inputPart,&fb);
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&fb);
    return;
  }
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 == 0) {
    FromYca::setFrameBuffer(this->_fromYca,base,xStride,yStride,&this->_channelNamePrefix);
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void
RgbaInputFile::setFrameBuffer (Rgba* base, size_t xStride, size_t yStride)
{
    if (_fromYca)
    {
        std::lock_guard<std::mutex> lock (*_fromYca);
        _fromYca->setFrameBuffer (base, xStride, yStride, _channelNamePrefix);
    }
    else
    {
        size_t xs = xStride * sizeof (Rgba);
        size_t ys = yStride * sizeof (Rgba);

        FrameBuffer fb;

        if (channels () & WRITE_Y)
        {
            fb.insert (
                _channelNamePrefix + "Y",
                Slice (
                    HALF,
                    (char*) &base[0].r,
                    xs,
                    ys,
                    1,
                    1,     // xSampling, ySampling
                    0.0)); // fillValue
        }
        else
        {

            fb.insert (
                _channelNamePrefix + "R",
                Slice (
                    HALF,
                    (char*) &base[0].r,
                    xs,
                    ys,
                    1,
                    1,     // xSampling, ySampling
                    0.0)); // fillValue

            fb.insert (
                _channelNamePrefix + "G",
                Slice (
                    HALF,
                    (char*) &base[0].g,
                    xs,
                    ys,
                    1,
                    1,     // xSampling, ySampling
                    0.0)); // fillValue

            fb.insert (
                _channelNamePrefix + "B",
                Slice (
                    HALF,
                    (char*) &base[0].b,
                    xs,
                    ys,
                    1,
                    1,     // xSampling, ySampling
                    0.0)); // fillValue
        }
        fb.insert (
            _channelNamePrefix + "A",
            Slice (
                HALF,
                (char*) &base[0].a,
                xs,
                ys,
                1,
                1,     // xSampling, ySampling
                1.0)); // fillValue

        _inputPart->setFrameBuffer (fb);
    }
}